

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBhash.h
# Opt level: O0

void __thiscall bwtil::DBhash::initAuxHash(DBhash *this)

{
  undefined1 auVar1 [16];
  pair<unsigned_long,_unsigned_long> interval_00;
  ostream *poVar2;
  value_type vVar3;
  ulint W;
  unsigned_long in_RDI;
  undefined1 auVar4 [64];
  ulint i_1;
  pair<unsigned_long,_unsigned_long> interval;
  ulint i;
  int last_perc;
  int perc;
  ulint empty;
  packed_view<std::vector> *in_stack_fffffffffffffed8;
  packed_view<std::vector> *in_stack_fffffffffffffee0;
  unsigned_long in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  IndexedBWT *this_00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar5;
  long local_c0;
  int local_78 [2];
  pair<unsigned_long,_unsigned_long> local_70;
  pair<unsigned_long,_unsigned_long> local_60;
  IndexedBWT *local_50;
  int local_48;
  int local_44;
  value_type local_40;
  undefined1 extraout_var [56];
  
  auVar4._0_8_ = std::log2<unsigned_long>(0x1468f7);
  auVar4._8_56_ = extraout_var;
  auVar1 = vroundsd_avx(auVar4._0_16_,auVar4._0_16_,10);
  vcvttsd2usi_avx512f(auVar1);
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
             ,in_stack_ffffffffffffff00);
  bv::internal::packed_view<std::vector>::operator=
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x146943);
  local_40 = *(long *)(in_RDI + 0x28) + 1;
  local_48 = -1;
  for (local_50 = (IndexedBWT *)0x0; local_50 < *(IndexedBWT **)(in_RDI + 0x20);
      local_50 = (IndexedBWT *)((long)&local_50->sigma + 1)) {
    W = in_RDI + 0xb0;
    uVar5 = *(undefined4 *)(in_RDI + 0x18);
    local_78[1] = 0;
    local_78[0] = 0;
    this_00 = local_50;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_70,local_78 + 1,local_78);
    interval_00.first._4_4_ = uVar5;
    interval_00.first._0_4_ = in_stack_ffffffffffffff10;
    interval_00.second = in_RDI;
    local_60 = IndexedBWT::BS(this_00,W,(uint)(in_stack_fffffffffffffef8 >> 0x20),interval_00);
    if (local_60.first < local_60.second) {
      in_stack_fffffffffffffef8 = local_60.first;
      bv::internal::packed_view<std::vector>::operator[]
                (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)
                 in_stack_fffffffffffffee0,(value_type)in_stack_fffffffffffffed8);
    }
    else {
      bv::internal::packed_view<std::vector>::operator[]
                (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)
                 in_stack_fffffffffffffee0,(value_type)in_stack_fffffffffffffed8);
    }
    local_44 = (int)((ulong)((long)local_50 * 100) / *(ulong *)(in_RDI + 0x20));
    if ((local_48 < local_44) && (local_44 % 10 == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"   ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_44);
      poVar2 = std::operator<<(poVar2,"% done.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_48 = local_44;
    }
  }
  bv::internal::packed_view<std::vector>::operator[]
            (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
  vVar3 = bv::internal::item_reference::operator_cast_to_unsigned_long
                    ((item_reference<bv::internal::packed_view<std::vector>_> *)0x146b99);
  if (vVar3 == local_40) {
    bv::internal::packed_view<std::vector>::operator[]
              (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
              ((item_reference<bv::internal::packed_view<std::vector>_> *)in_stack_fffffffffffffee0,
               (value_type)in_stack_fffffffffffffed8);
  }
  local_c0 = *(long *)(in_RDI + 0x20);
  while (local_c0 = local_c0 + -1, local_c0 != 0) {
    bv::internal::packed_view<std::vector>::operator[]
              (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    vVar3 = bv::internal::item_reference::operator_cast_to_unsigned_long
                      ((item_reference<bv::internal::packed_view<std::vector>_> *)0x146c2d);
    if (vVar3 == local_40) {
      in_stack_fffffffffffffee0 =
           (packed_view<std::vector> *)
           bv::internal::packed_view<std::vector>::get
                     (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      bv::internal::packed_view<std::vector>::operator[]
                (in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)
                 in_stack_fffffffffffffee0,(value_type)in_stack_fffffffffffffed8);
    }
  }
  return;
}

Assistant:

void initAuxHash(){

		auxiliary_hash =  packed_view_t(ceil(log2(n+1)),auxiliary_hash_size);

		ulint empty = text_fingerprint_length+1;

		int perc,last_perc=-1;

		for (ulint i = 0; i < auxiliary_hash_size; i++){

			pair<ulint,ulint> interval = indexedBWT.BS(i,w_aux);

			if(interval.second>interval.first)
				auxiliary_hash[i] = interval.first;
			else
				auxiliary_hash[i] = empty;

			perc = (100*i)/auxiliary_hash_size;
			if(perc>last_perc and perc%10==0){

				cout << "   " <<  perc << "% done." << endl;
				last_perc=perc;

			}

		}

		if (auxiliary_hash[auxiliary_hash_size-1] == empty)
			auxiliary_hash[auxiliary_hash_size-1] = text_fingerprint_length;

		for (ulint i = auxiliary_hash_size - 1; i >= 1; i--) {

			if (auxiliary_hash[i-1] == empty)
				auxiliary_hash[i-1] = auxiliary_hash.get(i);

		}

	}